

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_GetImageOffset
          (ktxTexture1 *This,ktx_uint32_t level,ktx_uint32_t layer,ktx_uint32_t faceSlice,
          ktx_size_t *pOffset)

{
  ktx_size_t kVar1;
  uint in_ECX;
  ktxFormatVersionEnum in_EDX;
  uint in_ESI;
  ktxTexture *in_RDI;
  ktx_size_t *in_R8;
  ktx_size_t imageSize;
  ktx_size_t layerSize;
  ktx_uint32_t maxSlice;
  uint local_44;
  ktx_error_code_e local_4;
  
  if (in_RDI == (ktxTexture *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if ((in_ESI < in_RDI->numLevels) && (in_EDX < in_RDI->numLayers)) {
    if ((in_RDI->isCubemap & 1U) == 0) {
      if (in_RDI->baseDepth >> ((byte)in_ESI & 0x1f) == 0) {
        local_44 = 1;
      }
      else {
        local_44 = in_RDI->baseDepth >> ((byte)in_ESI & 0x1f);
      }
      if (local_44 <= in_ECX) {
        return KTX_INVALID_OPERATION;
      }
    }
    else if (in_RDI->numFaces <= in_ECX) {
      return KTX_INVALID_OPERATION;
    }
    kVar1 = (*(in_RDI->_protected->_vtbl).calcDataSizeLevels)(in_RDI,in_ESI);
    *in_R8 = kVar1;
    if (in_EDX != 0) {
      kVar1 = ktxTexture_layerSize(in_RDI,in_ESI,in_EDX);
      *in_R8 = in_EDX * kVar1 + *in_R8;
    }
    if (in_ECX != 0) {
      kVar1 = (*in_RDI->vtbl->GetImageSize)(in_RDI,in_ESI);
      *in_R8 = in_ECX * kVar1 + *in_R8;
    }
    local_4 = KTX_SUCCESS;
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture1_GetImageOffset(ktxTexture1* This, ktx_uint32_t level,
                          ktx_uint32_t layer, ktx_uint32_t faceSlice,
                          ktx_size_t* pOffset)
{

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (level >= This->numLevels || layer >= This->numLayers)
        return KTX_INVALID_OPERATION;

    if (This->isCubemap) {
        if (faceSlice >= This->numFaces)
            return KTX_INVALID_OPERATION;
    } else {
        ktx_uint32_t maxSlice = MAX(1, This->baseDepth >> level);
        if (faceSlice >= maxSlice)
            return KTX_INVALID_OPERATION;
    }

    // Get the size of the data up to the start of the indexed level.
    *pOffset = ktxTexture_calcDataSizeLevels(ktxTexture(This), level);

    // All layers, faces & slices within a level are the same size.
    if (layer != 0) {
        ktx_size_t layerSize;
        layerSize = ktxTexture_layerSize(ktxTexture(This), level,
                                                    KTX_FORMAT_VERSION_ONE);
        *pOffset += layer * layerSize;
    }
    if (faceSlice != 0) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_GetImageSize(ktxTexture(This), level);
#if (KTX_GL_UNPACK_ALIGNMENT != 4)
        if (This->isCubemap)
            _KTX_PAD4(imageSize); // Account for cubePadding.
#endif
        *pOffset += faceSlice * imageSize;
    }

    return KTX_SUCCESS;
}